

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_zhao_2010.h
# Opt level: O0

void __thiscall SBLA::FirstScan(SBLA *this)

{
  long lVar1;
  int iVar2;
  size_t *psVar3;
  int *piVar4;
  bool bVar5;
  bool local_181;
  int newroot_1;
  int curpix_1;
  int j_1;
  int local_154;
  int runstop_1;
  int local_14c;
  uint local_148;
  int runstart_1;
  int linepix_1;
  int i_1;
  int lastroot_1;
  int stripestop_1;
  int evenpix_3;
  int stripestart_1;
  int Gp_1;
  int evenpix_2;
  int c_3;
  int c_2;
  uint *img_labels_row_1;
  uchar *img_row_1;
  int newroot;
  int curpix;
  int j;
  int local_fc;
  int runstop;
  int local_f4;
  uint local_f0;
  int runstart;
  int linepix;
  int i;
  int lastroot;
  int stripestop;
  int oddpix_1;
  int evenpix_1;
  int stripestart;
  int Gp;
  int oddpix;
  int evenpix;
  int c_1;
  int c;
  uint *img_labels_row_fol;
  uint *img_labels_row;
  uchar *img_row_fol;
  uchar *img_row;
  int r;
  int iStack_94;
  bool o_rows;
  int e_rows;
  int N2;
  int r1N;
  int rN;
  uint *img_labels_row_prev;
  Mat_<int> local_70;
  SBLA *local_10;
  SBLA *this_local;
  
  this->N = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  this->M = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  local_10 = this;
  cv::Mat_<int>::Mat_(&local_70,this->M,this->N);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_70)
  ;
  cv::Mat_<int>::~Mat_(&local_70);
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 =
       **(undefined1 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10;
  if ((this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 != '\0') {
    **(undefined1 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10 = 0;
    if (this->M == 1) {
      if (this->N == 1) {
        (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 1;
      }
      else {
        (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ =
             (uint)(*(char *)(*(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                        field_0x10 + 1) == '\0');
      }
    }
    else if (this->N == 1) {
      lVar1 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10;
      psVar3 = cv::MatStep::operator[]
                         ((MatStep *)
                          &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48,0);
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ =
           (uint)(*(char *)(lVar1 + *psVar3) == '\0');
    }
    else {
      local_181 = false;
      if (*(char *)(*(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10
                   + 1) == '\0') {
        lVar1 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10;
        psVar3 = cv::MatStep::operator[]
                           ((MatStep *)
                            &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48,0
                           );
        local_181 = false;
        if (*(char *)(lVar1 + *psVar3) == '\0') {
          lVar1 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10;
          psVar3 = cv::MatStep::operator[]
                             ((MatStep *)
                              &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48
                              ,0);
          local_181 = *(char *)(lVar1 + 1 + *psVar3) == '\0';
        }
      }
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = (uint)local_181;
    }
  }
  _r1N = 0;
  N2 = 0;
  e_rows = this->N;
  iStack_94 = this->N << 1;
  r = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8 &
      0xfffffffe;
  img_row._7_1_ =
       *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8 % 2 == 1
  ;
  img_row._0_4_ = 0;
  do {
    if (r <= (int)img_row) {
      if ((img_row._7_1_ & 1) != 0) {
        img_labels_row_1 =
             (uint *)cv::Mat::ptr<unsigned_char>
                               (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                 super_Mat,(int)img_row);
        _c_3 = cv::Mat::ptr<unsigned_int>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           super_Mat,(int)img_row);
        for (evenpix_2 = 0; evenpix_2 < this->N; evenpix_2 = evenpix_2 + 1) {
          _c_3[evenpix_2] = (uint)*(byte *)((long)img_labels_row_1 + (long)evenpix_2);
        }
        for (Gp_1 = 0; runstart_1 = Gp_1, Gp_1 < this->N; Gp_1 = Gp_1 + 1) {
          stripestart_1 = _c_3[Gp_1];
          if (stripestart_1 != 0) {
            evenpix_3 = -(N2 + Gp_1);
            _c_3[Gp_1] = evenpix_3;
            stripestop_1 = Gp_1;
            while ((i_1 = Gp_1 + 1, Gp_1 = i_1, i_1 < this->N &&
                   (lastroot_1 = _c_3[i_1], lastroot_1 != 0))) {
              _c_3[i_1] = evenpix_3;
            }
            if ((int)img_row != 0) {
              linepix_1 = -0x80000000;
              for (; runstart_1 < i_1; runstart_1 = runstart_1 + 1) {
                local_148 = _c_3[runstart_1];
                if (local_148 != 0) {
                  runstop_1 = 0;
                  local_154 = runstart_1 + -1;
                  piVar4 = std::max<int>(&runstop_1,&local_154);
                  local_14c = *piVar4;
                  do {
                    runstart_1 = runstart_1 + 1;
                    bVar5 = false;
                    if (runstart_1 < this->N) {
                      bVar5 = _c_3[runstart_1] != 0;
                    }
                  } while (bVar5);
                  curpix_1 = this->N + -1;
                  piVar4 = std::min<int>(&curpix_1,&runstart_1);
                  j_1 = *piVar4;
                  for (newroot_1 = local_14c; newroot_1 <= j_1; newroot_1 = newroot_1 + 1) {
                    iVar2 = *(int *)(_r1N + (long)newroot_1 * 4);
                    if (iVar2 != 0) {
                      iVar2 = FindRoot(this,*(int **)&((this->
                                                  super_Labeling2D<(Connectivity2D)8,_false>).
                                                  img_labels_)->field_0x10,iVar2);
                      if (linepix_1 < iVar2) {
                        linepix_1 = iVar2;
                        FindRootAndCompress(this,*(int **)&((this->
                                                  super_Labeling2D<(Connectivity2D)8,_false>).
                                                  img_labels_)->field_0x10,evenpix_3,iVar2);
                      }
                      else if (iVar2 < linepix_1) {
                        FindRootAndCompress(this,*(int **)&((this->
                                                  super_Labeling2D<(Connectivity2D)8,_false>).
                                                  img_labels_)->field_0x10,iVar2,linepix_1);
                      }
                      do {
                        newroot_1 = newroot_1 + 1;
                        bVar5 = false;
                        if (newroot_1 <= j_1) {
                          bVar5 = *(int *)(_r1N + (long)newroot_1 * 4) != 0;
                        }
                      } while (bVar5);
                    }
                  }
                }
              }
            }
          }
        }
      }
      return;
    }
    img_row_fol = cv::Mat::ptr<unsigned_char>
                            (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                             (int)img_row);
    img_labels_row =
         (uint *)(img_row_fol +
                 **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48);
    img_labels_row_fol =
         cv::Mat::ptr<unsigned_int>
                   (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                    (int)img_row);
    _c_1 = (long)img_labels_row_fol +
           **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48;
    for (evenpix = 0; evenpix < this->N; evenpix = evenpix + 1) {
      img_labels_row_fol[evenpix] = (uint)img_row_fol[evenpix];
      *(uint *)(_c_1 + (long)evenpix * 4) = (uint)*(byte *)((long)img_labels_row + (long)evenpix);
    }
    for (oddpix = 0; iVar2 = oddpix, oddpix < this->N; oddpix = oddpix + 1) {
      Gp = img_labels_row_fol[oddpix];
      stripestart = *(int *)(_c_1 + (long)oddpix * 4);
      if (stripestart == 0) {
        if (Gp != 0) {
          evenpix_1 = -(N2 + oddpix);
          img_labels_row_fol[oddpix] = evenpix_1;
          goto LAB_002555eb;
        }
      }
      else {
        evenpix_1 = -(e_rows + oddpix);
        *(int *)(_c_1 + (long)oddpix * 4) = evenpix_1;
        if (Gp != 0) {
          img_labels_row_fol[oddpix] = evenpix_1;
        }
LAB_002555eb:
        oddpix_1 = oddpix;
        while (i = oddpix + 1, oddpix = i, i < this->N) {
          stripestop = img_labels_row_fol[i];
          lastroot = *(int *)(_c_1 + (long)i * 4);
          if (lastroot == 0) {
            if (stripestop == 0) break;
            img_labels_row_fol[i] = evenpix_1;
          }
          else {
            *(int *)(_c_1 + (long)i * 4) = evenpix_1;
            if (stripestop != 0) {
              img_labels_row_fol[i] = evenpix_1;
            }
          }
        }
        if ((int)img_row != 0) {
          linepix = -0x80000000;
          for (runstart = iVar2; runstart < i; runstart = runstart + 1) {
            local_f0 = img_labels_row_fol[runstart];
            if (local_f0 != 0) {
              runstop = 0;
              local_fc = runstart + -1;
              piVar4 = std::max<int>(&runstop,&local_fc);
              local_f4 = *piVar4;
              do {
                runstart = runstart + 1;
                bVar5 = false;
                if (runstart < this->N) {
                  bVar5 = img_labels_row_fol[runstart] != 0;
                }
              } while (bVar5);
              curpix = this->N + -1;
              piVar4 = std::min<int>(&curpix,&runstart);
              j = *piVar4;
              for (newroot = local_f4; newroot <= j; newroot = newroot + 1) {
                img_row_1._4_4_ = *(int *)(_r1N + (long)newroot * 4);
                if (img_row_1._4_4_ != 0) {
                  img_row_1._0_4_ =
                       FindRoot(this,*(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).
                                               img_labels_)->field_0x10,img_row_1._4_4_);
                  if (linepix < (int)img_row_1) {
                    linepix = (int)img_row_1;
                    FindRootAndCompress(this,*(int **)&((this->
                                                  super_Labeling2D<(Connectivity2D)8,_false>).
                                                  img_labels_)->field_0x10,evenpix_1,(int)img_row_1)
                    ;
                  }
                  else if ((int)img_row_1 < linepix) {
                    FindRootAndCompress(this,*(int **)&((this->
                                                  super_Labeling2D<(Connectivity2D)8,_false>).
                                                  img_labels_)->field_0x10,(int)img_row_1,linepix);
                  }
                  do {
                    newroot = newroot + 1;
                    bVar5 = false;
                    if (newroot <= j) {
                      bVar5 = *(int *)(_r1N + (long)newroot * 4) != 0;
                    }
                  } while (bVar5);
                }
              }
            }
          }
        }
      }
    }
    _r1N = _c_1;
    N2 = iStack_94 + N2;
    e_rows = iStack_94 + e_rows;
    img_row._0_4_ = (int)img_row + 2;
  } while( true );
}

Assistant:

void FirstScan()
    {
        N = img_.cols;
        M = img_.rows;
        img_labels_ = cv::Mat1i(M, N);

        // Fix for first pixel!
        n_labels_ = 0;
        firstpixel = img_.data[0];
        if (firstpixel) {
            const_cast<cv::Mat1b&>(img_).data[0] = 0;

            if (M == 1) {
                if (N == 1)
                    n_labels_ = 1;
                else
                    n_labels_ = img_.data[1] == 0;
            }
            else {
                if (N == 1)
                    n_labels_ = img_.data[img_.step[0]] == 0;
                else
                    n_labels_ = img_.data[1] == 0 && img_.data[img_.step[0]] == 0 && img_.data[img_.step[0] + 1] == 0;
            }
        }

        // Stripe extraction and representation
        unsigned int* img_labels_row_prev = nullptr;
        int rN = 0;
        int r1N = N;
        int N2 = N * 2;

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            for (int c = 0; c < N; ++c) {
                img_labels_row[c] = img_row[c];
                img_labels_row_fol[c] = img_row_fol[c];
            }

            for (int c = 0; c < N; ++c) {
                // Step 1
                int evenpix = img_labels_row[c];
                int oddpix = img_labels_row_fol[c];

                // Step 2
                int Gp;
                if (oddpix) {
                    img_labels_row_fol[c] = Gp = -(r1N + c);
                    if (evenpix)
                        img_labels_row[c] = Gp;
                }
                else if (evenpix)
                    img_labels_row[c] = Gp = -(rN + c);
                else
                    continue;

                // Step 3
                int stripestart = c;
                while (++c < N) {
                    int evenpix = img_labels_row[c];
                    int oddpix = img_labels_row_fol[c];

                    if (oddpix) {
                        img_labels_row_fol[c] = Gp;
                        if (evenpix)
                            img_labels_row[c] = Gp;
                    }
                    else if (evenpix)
                        img_labels_row[c] = Gp;
                    else
                        break;
                }
                int stripestop = c;

                if (r == 0)
                    continue;

                // Stripe union
                int lastroot = INT_MIN;
                for (int i = stripestart; i < stripestop; ++i) {
                    int linepix = img_labels_row[i];
                    if (!linepix)
                        continue;

                    int runstart = std::max(0, i - 1);
                    do
                        i++;
                    while (i < N && img_labels_row[i]);
                    int runstop = std::min(N - 1, i);

                    for (int j = runstart; j <= runstop; ++j) {
                        int curpix = img_labels_row_prev[j];
                        if (!curpix)
                            continue;

                        int newroot = FindRoot(reinterpret_cast<int*>(img_labels_.data), curpix);
                        if (newroot > lastroot) {
                            lastroot = newroot;
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), Gp, lastroot);
                        }
                        else if (newroot < lastroot) {
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), newroot, lastroot);
                        }

                        do
                            ++j;
                        while (j <= runstop && img_labels_row_prev[j]);
                    }
                }
            }
            img_labels_row_prev = img_labels_row_fol;
            rN += N2;
            r1N += N2;
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            for (int c = 0; c < N; ++c) {
                img_labels_row[c] = img_row[c];
            }

            for (int c = 0; c < N; ++c) {
                // Step 1
                int evenpix = img_labels_row[c];

                // Step 2
                int Gp;
                if (evenpix)
                    img_labels_row[c] = Gp = -(rN + c);
                else
                    continue;

                // Step 3
                int stripestart = c;
                while (++c < N) {
                    int evenpix = img_labels_row[c];

                    if (evenpix)
                        img_labels_row[c] = Gp;
                    else
                        break;
                }
                int stripestop = c;

                if (r == 0)
                    continue;

                // Stripe union
                int lastroot = INT_MIN;
                for (int i = stripestart; i < stripestop; ++i) {
                    int linepix = img_labels_row[i];
                    if (!linepix)
                        continue;

                    int runstart = std::max(0, i - 1);
                    do
                        i++;
                    while (i < N && img_labels_row[i]);
                    int runstop = std::min(N - 1, i);

                    for (int j = runstart; j <= runstop; ++j) {
                        int curpix = img_labels_row_prev[j];
                        if (!curpix)
                            continue;

                        int newroot = FindRoot(reinterpret_cast<int*>(img_labels_.data), curpix);
                        if (newroot > lastroot) {
                            lastroot = newroot;
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), Gp, lastroot);
                        }
                        else if (newroot < lastroot) {
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), newroot, lastroot);
                        }

                        do
                            ++j;
                        while (j <= runstop && img_labels_row_prev[j]);
                    }
                }
            }
        }
    }